

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

XMLCharEncoding XMLParser::XMLNode::guessCharEncoding(void *buf,int l,char useXMLEncodingAttribute)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  char local_108 [8];
  char bb [201];
  int local_30;
  XMLCharEncoding local_2c;
  int i;
  XMLCharEncoding bestGuess;
  uchar *b;
  char useXMLEncodingAttribute_local;
  int l_local;
  void *buf_local;
  
  if (l < 0x19) {
    buf_local._4_4_ = char_encoding_error;
  }
  else if ((guessWideCharChars == '\0') || (cVar2 = myIsTextWideChar(buf,l), cVar2 == '\0')) {
    if (((*buf == -0x11) && (*(char *)((long)buf + 1) == -0x45)) &&
       (*(char *)((long)buf + 2) == -0x41)) {
      buf_local._4_4_ = char_encoding_UTF8;
    }
    else {
      local_2c = char_encoding_UTF8;
      local_30 = 0;
      while (local_30 < l) {
        switch(XML_utf8ByteTable[*(byte *)((long)buf + (long)local_30)]) {
        case 0:
          local_30 = l;
          break;
        case 4:
          local_30 = local_30 + 1;
          if ((local_30 < l) && ((*(byte *)((long)buf + (long)local_30) & 0xc0) != 0x80)) {
            local_2c = char_encoding_legacy;
            local_30 = l;
          }
        case 3:
          local_30 = local_30 + 1;
          if ((local_30 < l) && ((*(byte *)((long)buf + (long)local_30) & 0xc0) != 0x80)) {
            local_2c = char_encoding_legacy;
            local_30 = l;
          }
        case 2:
          local_30 = local_30 + 1;
          if ((local_30 < l) && ((*(byte *)((long)buf + (long)local_30) & 0xc0) != 0x80)) {
            local_2c = char_encoding_legacy;
            local_30 = l;
          }
        case 1:
          local_30 = local_30 + 1;
        }
      }
      if (useXMLEncodingAttribute == '\0') {
        buf_local._4_4_ = local_2c;
      }
      else {
        iVar3 = mmin(l,200);
        memcpy(local_108,buf,(long)iVar3);
        local_108[iVar3] = '\0';
        _i = strstr(local_108,"encoding");
        if (_i == (char *)0x0) {
          buf_local._4_4_ = local_2c;
        }
        else {
          _i = _i + 8;
          while( true ) {
            bVar4 = true;
            if (((*_i != '\n') && (bVar4 = true, *_i != ' ')) && (bVar4 = true, *_i != '\t')) {
              bVar4 = *_i == '\r';
            }
            if (!bVar4) break;
            _i = _i + 1;
          }
          if (*_i == '=') {
            do {
              pcVar1 = _i;
              _i = pcVar1 + 1;
              bVar4 = true;
              if (((*_i != '\n') && (bVar4 = true, *_i != ' ')) && (bVar4 = true, *_i != '\t')) {
                bVar4 = *_i == '\r';
              }
            } while (bVar4);
            if ((*_i == '\'') || (*_i == '\"')) {
              _i = pcVar1 + 2;
              while( true ) {
                bVar4 = true;
                if (((*_i != '\n') && (bVar4 = true, *_i != ' ')) && (bVar4 = true, *_i != '\t')) {
                  bVar4 = *_i == '\r';
                }
                if (!bVar4) break;
                _i = _i + 1;
              }
              iVar3 = xstrnicmp(_i,"utf-8",5);
              if ((iVar3 == 0) || (iVar3 = xstrnicmp(_i,"utf8",4), iVar3 == 0)) {
                if (local_2c == char_encoding_legacy) {
                  buf_local._4_4_ = char_encoding_error;
                }
                else {
                  buf_local._4_4_ = char_encoding_UTF8;
                }
              }
              else {
                iVar3 = xstrnicmp(_i,"shiftjis",8);
                if ((iVar3 == 0) ||
                   ((iVar3 = xstrnicmp(_i,"shift-jis",9), iVar3 == 0 ||
                    (iVar3 = xstrnicmp(_i,"sjis",4), iVar3 == 0)))) {
                  buf_local._4_4_ = char_encoding_ShiftJIS;
                }
                else {
                  iVar3 = xstrnicmp(_i,"GB2312",6);
                  if (iVar3 == 0) {
                    buf_local._4_4_ = char_encoding_GB2312;
                  }
                  else {
                    iVar3 = xstrnicmp(_i,"Big5",4);
                    if (iVar3 == 0) {
                      buf_local._4_4_ = char_encoding_Big5;
                    }
                    else {
                      iVar3 = xstrnicmp(_i,"GBK",3);
                      if (iVar3 == 0) {
                        buf_local._4_4_ = char_encoding_GBK;
                      }
                      else {
                        buf_local._4_4_ = char_encoding_legacy;
                      }
                    }
                  }
                }
              }
            }
            else {
              buf_local._4_4_ = local_2c;
            }
          }
          else {
            buf_local._4_4_ = local_2c;
          }
        }
      }
    }
  }
  else {
    buf_local._4_4_ = char_encoding_error;
  }
  return buf_local._4_4_;
}

Assistant:

XMLNode::XMLCharEncoding
      XMLNode::guessCharEncoding(void * buf, int l, char useXMLEncodingAttribute)
    {
#ifdef _XMLWIDECHAR
        return (XMLCharEncoding)0;
#else
        if(l < 25)
            return (XMLCharEncoding)0;
        if(guessWideCharChars && (myIsTextWideChar(buf, l)))
            return (XMLCharEncoding)0;
        unsigned char * b = (unsigned char *)buf;
        if((b[0] == 0xef) && (b[1] == 0xbb) && (b[2] == 0xbf))
            return char_encoding_UTF8;

        // Match utf-8 model ?
        XMLCharEncoding bestGuess = char_encoding_UTF8;
        int i = 0;
        while(i < l)
            switch(XML_utf8ByteTable[b[i]])
            {
                case 4:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 3:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 2:
                    i++;
                    if((i < l) && (b[i] & 0xC0) != 0x80)
                    {
                        bestGuess = char_encoding_legacy;
                        i = l;
                    }   // 10bbbbbb ?
                case 1:
                    i++;
                    break;
                case 0:
                    i = l;
            }
        if(!useXMLEncodingAttribute)
            return bestGuess;
        // if encoding is specified and different from utf-8 than it's non-utf8
        // otherwise it's utf-8
        char bb[201];
        l = mmin(l, 200);
        memcpy(bb, buf, l);   // copy buf into bb to be able to do "bb[l]=0"
        bb[l] = 0;
        b = (unsigned char *)strstr(bb, "encoding");
        if(!b)
            return bestGuess;
        b += 8;
        while
            XML_isSPACECHAR(*b) b++;
        if(*b != '=')
            return bestGuess;
        b++;
        while
            XML_isSPACECHAR(*b) b++;
        if((*b != '\'') && (*b != '"'))
            return bestGuess;
        b++;
        while
            XML_isSPACECHAR(*b) b++;

        if((xstrnicmp((char *)b, "utf-8", 5) == 0) || (xstrnicmp((char *)b, "utf8", 4) == 0))
        {
            if(bestGuess == char_encoding_legacy)
                return char_encoding_error;
            return char_encoding_UTF8;
        }

        if((xstrnicmp((char *)b, "shiftjis", 8) == 0) || (xstrnicmp((char *)b, "shift-jis", 9) == 0)
           || (xstrnicmp((char *)b, "sjis", 4) == 0))
            return char_encoding_ShiftJIS;

        if(xstrnicmp((char *)b, "GB2312", 6) == 0)
            return char_encoding_GB2312;
        if(xstrnicmp((char *)b, "Big5", 4) == 0)
            return char_encoding_Big5;
        if(xstrnicmp((char *)b, "GBK", 3) == 0)
            return char_encoding_GBK;

        return char_encoding_legacy;
#endif
    }